

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_ray * rf_get_mouse_ray(rf_ray *__return_storage_ptr__,rf_sizei screen_size,rf_vec2 mouse_position
                         ,rf_camera3d camera)

{
  float fVar1;
  float fVar2;
  rf_mat proj;
  rf_mat proj_00;
  rf_mat proj_01;
  rf_mat view;
  rf_mat view_00;
  rf_mat view_01;
  uint uVar3;
  undefined8 in_XMM0_Qb;
  undefined1 auVar5 [16];
  double dVar4;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar11;
  undefined1 auVar12 [16];
  float fVar15;
  double dVar13;
  undefined1 auVar14 [16];
  rf_vec3 rVar16;
  rf_vec3 rVar17;
  rf_vec3 rVar18;
  rf_mat result;
  rf_mat mat_view;
  float local_f0;
  float fStack_e8;
  float fStack_e4;
  float fStack_dc;
  undefined4 uStack_d8;
  float fStack_d4;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 uStack_b8;
  undefined4 local_b4;
  float local_a8;
  float fStack_a4;
  rf_mat local_78;
  undefined8 local_38;
  undefined1 auVar9 [16];
  undefined4 uVar10;
  
  (__return_storage_ptr__->direction).y = 0.0;
  (__return_storage_ptr__->direction).z = 0.0;
  (__return_storage_ptr__->position).x = 0.0;
  (__return_storage_ptr__->position).y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->position).z = 0;
  auVar5._0_4_ = mouse_position.x + mouse_position.x;
  auVar5._4_4_ = mouse_position.y + mouse_position.y;
  fVar11 = (float)((ulong)in_XMM0_Qb >> 0x20);
  auVar5._8_4_ = (float)in_XMM0_Qb + (float)in_XMM0_Qb;
  auVar5._12_4_ = fVar11 + fVar11;
  auVar12._0_4_ = (float)screen_size.width;
  auVar12._4_4_ = (float)screen_size.height;
  auVar12._8_8_ = 0;
  auVar5 = divps(auVar5,auVar12);
  fVar11 = auVar5._0_4_ + -1.0;
  fVar15 = 1.0 - auVar5._4_4_;
  rf_mat_look_at(&local_78,camera.position,camera.target,camera.up);
  uStack_d8 = 0;
  fStack_d4 = 0.0;
  uStack_c4 = 0;
  uStack_b8 = 0;
  fStack_e8 = 0.0;
  fStack_e4 = 0.0;
  local_f0 = 1.0;
  fStack_dc = 1.0;
  uStack_c8 = 0x3f800000;
  local_b4 = 0x3f800000;
  if (camera.type == RF_CAMERA_ORTHOGRAPHIC) {
    fVar1 = camera.fovy * 0.5;
    fVar2 = (auVar12._0_4_ / auVar12._4_4_) * fVar1;
    local_f0 = 2.0 / (fVar2 + fVar2);
    fStack_dc = 2.0 / (fVar1 + fVar1);
    fStack_e4 = -(fVar2 - fVar2) / (fVar2 + fVar2);
    fStack_d4 = -(fVar1 - fVar1) / (fVar1 + fVar1);
    fStack_e8 = 0.0;
    uStack_c8 = 0xbb0312c5;
    uStack_c4 = 0xbf8000a8;
    local_b4 = 0x3f800000;
  }
  else if (camera.type == RF_CAMERA_PERSPECTIVE) {
    dVar4 = tan((double)(camera.fovy * 0.017453292) * 0.5);
    dVar4 = dVar4 * 0.01;
    dVar13 = ((double)screen_size.width / (double)screen_size.height) * dVar4;
    auVar6._0_8_ = dVar4 + dVar4;
    auVar6._8_8_ = extraout_XMM0_Qb;
    auVar7._4_12_ = auVar6._4_12_;
    auVar7._0_4_ = (float)auVar6._0_8_;
    local_f0 = 0.02 / (float)(dVar13 + dVar13);
    fStack_e8 = ((float)dVar13 - (float)dVar13) / (float)(dVar13 + dVar13);
    auVar14._4_4_ = (float)dVar4 - (float)dVar4;
    auVar14._0_4_ = 0x3ca3d70a;
    auVar14._8_8_ = 0;
    uVar10 = (undefined4)((ulong)auVar6._0_8_ >> 0x20);
    auVar9._0_8_ = auVar7._0_8_;
    auVar9._8_4_ = uVar10;
    auVar9._12_4_ = uVar10;
    auVar8._8_8_ = auVar9._8_8_;
    auVar8._4_4_ = auVar7._0_4_;
    auVar8._0_4_ = auVar7._0_4_;
    auVar5 = divps(auVar14,auVar8);
    fStack_e4 = 0.0;
    fStack_dc = auVar5._0_4_;
    uStack_d8 = auVar5._4_4_;
    fStack_d4 = 0.0;
    uStack_c8 = 0xbf8000a8;
    uStack_c4 = 0xbca3d776;
    uStack_b8 = 0xbf800000;
    local_b4 = 0;
  }
  proj.m4 = 0.0;
  proj.m0 = local_f0;
  proj.m12 = fStack_e4;
  proj.m8 = fStack_e8;
  proj.m13 = fStack_d4;
  proj.m9 = (float)uStack_d8;
  proj.m14 = (float)uStack_c4;
  proj.m10 = (float)uStack_c8;
  proj.m15 = (float)local_b4;
  proj.m11 = (float)uStack_b8;
  rVar16.y = fVar15;
  rVar16.x = fVar11;
  proj.m1 = (float)(int)((ulong)(uint)fStack_dc << 0x20);
  proj.m5 = (float)(int)(((ulong)(uint)fStack_dc << 0x20) >> 0x20);
  proj.m2 = 0.0;
  proj.m6 = 0.0;
  proj.m3 = 0.0;
  proj.m7 = 0.0;
  view.m8 = local_78.m8;
  view.m12 = local_78.m12;
  view.m0 = local_78.m0;
  view.m4 = local_78.m4;
  view.m1 = local_78.m1;
  view.m5 = local_78.m5;
  view.m9 = local_78.m9;
  view.m13 = local_78.m13;
  view.m2 = local_78.m2;
  view.m6 = local_78.m6;
  view.m10 = local_78.m10;
  view.m14 = local_78.m14;
  view.m3 = local_78.m3;
  view.m7 = local_78.m7;
  view.m11 = local_78.m11;
  view.m15 = local_78.m15;
  rVar16.z = 0.0;
  rVar16 = rf_unproject(rVar16,proj,view);
  local_38 = rVar16._0_8_;
  proj_00.m4 = 0.0;
  proj_00.m0 = local_f0;
  proj_00.m12 = fStack_e4;
  proj_00.m8 = fStack_e8;
  proj_00.m13 = fStack_d4;
  proj_00.m9 = (float)uStack_d8;
  proj_00.m14 = (float)uStack_c4;
  proj_00.m10 = (float)uStack_c8;
  proj_00.m15 = (float)local_b4;
  proj_00.m11 = (float)uStack_b8;
  rVar17.y = fVar15;
  rVar17.x = fVar11;
  proj_00.m1 = (float)(int)((ulong)(uint)fStack_dc << 0x20);
  proj_00.m5 = (float)(int)(((ulong)(uint)fStack_dc << 0x20) >> 0x20);
  proj_00.m2 = 0.0;
  proj_00.m6 = 0.0;
  proj_00.m3 = 0.0;
  proj_00.m7 = 0.0;
  view_00.m8 = local_78.m8;
  view_00.m12 = local_78.m12;
  view_00.m0 = local_78.m0;
  view_00.m4 = local_78.m4;
  view_00.m1 = local_78.m1;
  view_00.m5 = local_78.m5;
  view_00.m9 = local_78.m9;
  view_00.m13 = local_78.m13;
  view_00.m2 = local_78.m2;
  view_00.m6 = local_78.m6;
  view_00.m10 = local_78.m10;
  view_00.m14 = local_78.m14;
  view_00.m3 = local_78.m3;
  view_00.m7 = local_78.m7;
  view_00.m11 = local_78.m11;
  view_00.m15 = local_78.m15;
  rVar17.z = 1.0;
  rVar17 = rf_unproject(rVar17,proj_00,view_00);
  proj_01.m4 = 0.0;
  proj_01.m0 = local_f0;
  proj_01.m12 = fStack_e4;
  proj_01.m8 = fStack_e8;
  proj_01.m13 = fStack_d4;
  proj_01.m9 = (float)uStack_d8;
  proj_01.m14 = (float)uStack_c4;
  proj_01.m10 = (float)uStack_c8;
  proj_01.m15 = (float)local_b4;
  proj_01.m11 = (float)uStack_b8;
  rVar18.y = fVar15;
  rVar18.x = fVar11;
  proj_01.m1 = (float)(int)((ulong)(uint)fStack_dc << 0x20);
  proj_01.m5 = (float)(int)(((ulong)(uint)fStack_dc << 0x20) >> 0x20);
  proj_01.m2 = 0.0;
  proj_01.m6 = 0.0;
  proj_01.m3 = 0.0;
  proj_01.m7 = 0.0;
  view_01.m8 = local_78.m8;
  view_01.m12 = local_78.m12;
  view_01.m0 = local_78.m0;
  view_01.m4 = local_78.m4;
  view_01.m1 = local_78.m1;
  view_01.m5 = local_78.m5;
  view_01.m9 = local_78.m9;
  view_01.m13 = local_78.m13;
  view_01.m2 = local_78.m2;
  view_01.m6 = local_78.m6;
  view_01.m10 = local_78.m10;
  view_01.m14 = local_78.m14;
  view_01.m3 = local_78.m3;
  view_01.m7 = local_78.m7;
  view_01.m11 = local_78.m11;
  view_01.m15 = local_78.m15;
  rVar18.z = -1.0;
  rVar18 = rf_unproject(rVar18,proj_01,view_01);
  if (camera.type == RF_CAMERA_ORTHOGRAPHIC) {
    __return_storage_ptr__->position = rVar18;
  }
  else if (camera.type == RF_CAMERA_PERSPECTIVE) {
    (__return_storage_ptr__->position).z = camera.position.z;
    (__return_storage_ptr__->position).x = camera.position.x;
    (__return_storage_ptr__->position).y = camera.position.y;
  }
  fVar15 = rVar17.z - rVar16.z;
  local_a8 = rVar17.x;
  fStack_a4 = rVar17.y;
  local_a8 = local_a8 - (float)local_38;
  fStack_a4 = fStack_a4 - local_38._4_4_;
  fVar11 = SQRT(fVar15 * fVar15 + local_a8 * local_a8 + fStack_a4 * fStack_a4);
  uVar3 = -(uint)(fVar11 == 0.0);
  fVar11 = (float)(uVar3 & 0x3f800000 | ~uVar3 & (uint)(1.0 / fVar11));
  (__return_storage_ptr__->direction).x = fVar11 * local_a8;
  (__return_storage_ptr__->direction).y = fVar11 * fStack_a4;
  (__return_storage_ptr__->direction).z = fVar11 * fVar15;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_ray rf_get_mouse_ray(rf_sizei screen_size, rf_vec2 mouse_position, rf_camera3d camera)
{
    rf_ray ray = {0};

    // Calculate normalized device coordinates
    // NOTE: y value is negative
    float x = (2.0f * mouse_position.x) / (float) screen_size.width - 1.0f;
    float y = 1.0f - (2.0f * mouse_position.y) / (float) screen_size.height;
    float z = 1.0f;

    // Store values in a vector
    rf_vec3 device_coords = { x, y, z };

    // Calculate view matrix from camera look at
    rf_mat mat_view = rf_mat_look_at(camera.position, camera.target, camera.up);

    rf_mat mat_proj = rf_mat_identity();

    if (camera.type == RF_CAMERA_PERSPECTIVE)
    {
        // Calculate projection matrix from perspective
        mat_proj = rf_mat_perspective(camera.fovy * RF_DEG2RAD, ((double) screen_size.width / (double) screen_size.height), 0.01, 1000.0);
    }
    else if (camera.type == RF_CAMERA_ORTHOGRAPHIC)
    {
        float aspect = (float) screen_size.width / (float) screen_size.height;
        double top = camera.fovy / 2.0;
        double right = top * aspect;

        // Calculate projection matrix from orthographic
        mat_proj = rf_mat_ortho(-right, right, -top, top, 0.01, 1000.0);
    }

    // Unproject far/near points
    rf_vec3 near_point = rf_unproject((rf_vec3) {device_coords.x, device_coords.y, 0.0f}, mat_proj, mat_view);
    rf_vec3 far_point  = rf_unproject((rf_vec3) {device_coords.x, device_coords.y, 1.0f}, mat_proj, mat_view);

    // Unproject the mouse cursor in the near plane.
    // We need this as the source position because orthographic projects, compared to perspect doesn't have a
    // convergence point, meaning that the "eye" of the camera is more like a plane than a point.
    rf_vec3 camera_plane_pointer_pos = rf_unproject((rf_vec3) {device_coords.x, device_coords.y, -1.0f}, mat_proj,
                                                    mat_view);

    // Calculate normalized direction vector
    rf_vec3 direction = rf_vec3_normalize(rf_vec3_sub(far_point, near_point));

    if (camera.type == RF_CAMERA_PERSPECTIVE)
    {
        ray.position = camera.position;
    }
    else if (camera.type == RF_CAMERA_ORTHOGRAPHIC)
    {
        ray.position = camera_plane_pointer_pos;
    }

    // Apply calculated vectors to ray
    ray.direction = direction;

    return ray;
}